

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::GetSOName(string *__return_storage_ptr__,cmTarget *this,string *config)

{
  bool bVar1;
  long lVar2;
  undefined1 local_c8 [8];
  string pdbName;
  string impName;
  string realName;
  undefined1 local_60 [8];
  string name;
  allocator local_29;
  ImportInfo *local_28;
  ImportInfo *info;
  string *config_local;
  cmTarget *this_local;
  string *soName;
  
  info = (ImportInfo *)config;
  config_local = (string *)this;
  this_local = (cmTarget *)__return_storage_ptr__;
  bVar1 = IsImported(this);
  if (bVar1) {
    local_28 = GetImportInfo(this,(string *)info);
    if (local_28 == (ImportInfo *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
      std::allocator<char>::~allocator((allocator<char> *)&local_29);
    }
    else if ((local_28->NoSOName & 1U) == 0) {
      lVar2 = std::__cxx11::string::find((char *)&local_28->SOName,0x8f3dec);
      if (lVar2 == 0) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_28->SOName);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_28->SOName);
      }
    }
    else {
      cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&local_28->Location);
    }
  }
  else {
    std::__cxx11::string::string((string *)local_60);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)(impName.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(pdbName.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_c8);
    GetLibraryNames(this,(string *)local_60,__return_storage_ptr__,
                    (string *)(impName.field_2._M_local_buf + 8),
                    (string *)(pdbName.field_2._M_local_buf + 8),(string *)local_c8,(string *)info);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)(pdbName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(impName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetSOName(const std::string& config) const
{
  if(this->IsImported())
    {
    // Lookup the imported soname.
    if(cmTarget::ImportInfo const* info = this->GetImportInfo(config))
      {
      if(info->NoSOName)
        {
        // The imported library has no builtin soname so the name
        // searched at runtime will be just the filename.
        return cmSystemTools::GetFilenameName(info->Location);
        }
      else
        {
        // Use the soname given if any.
        if(info->SOName.find("@rpath/") == 0)
          {
          return info->SOName.substr(6);
          }
        return info->SOName;
        }
      }
    else
      {
      return "";
      }
    }
  else
    {
    // Compute the soname that will be built.
    std::string name;
    std::string soName;
    std::string realName;
    std::string impName;
    std::string pdbName;
    this->GetLibraryNames(name, soName, realName, impName, pdbName, config);
    return soName;
    }
}